

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

uint32_t event_track::find_event_samples
                   (vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                    *emsgs_in,
                   vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>
                   *samples_out,uint64_t segment_start,uint64_t segment_end,bool is_vtt)

{
  value_type vVar1;
  uint64_t uVar2;
  undefined4 uVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  const_reference pvVar7;
  DASHEventMessageBoxv1 local_250;
  EventMessageInstanceBox local_178;
  ulong local_a0;
  uint64_t pt_du;
  uint64_t pt;
  undefined1 auStack_88 [4];
  uint k;
  EventSample s;
  int i;
  undefined1 auStack_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> sample_boundaries;
  bool is_vtt_local;
  uint64_t segment_end_local;
  uint64_t segment_start_local;
  vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> *samples_out_local;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  *emsgs_in_local;
  
  auStack_48 = (undefined1  [8])0x0;
  sample_boundaries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sample_boundaries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sample_boundaries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = is_vtt;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48);
  find_sample_boundaries
            (emsgs_in,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48,
             segment_start,segment_end);
  s.is_vtt_ = false;
  s.is_emeb_ = false;
  s._42_2_ = 0;
  while( true ) {
    uVar3 = s._40_4_;
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48);
    if ((int)sVar4 + -1 <= (int)uVar3) break;
    EventSample::EventSample((EventSample *)auStack_88);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48,
                        (long)(int)s._40_4_);
    _auStack_88 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48,
                        (long)(s._40_4_ + 1));
    vVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48,
                        (long)(int)s._40_4_);
    s.sample_presentation_time_._0_4_ = (int)vVar1 - (int)*pvVar5;
    s.instance_boxes_.
    super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
    s.instance_boxes_.
    super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
         sample_boundaries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage._7_1_ & 1;
    pt._4_4_ = 0;
    while( true ) {
      uVar6 = (ulong)pt._4_4_;
      sVar4 = std::
              vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
              ::size(emsgs_in);
      if (sVar4 <= uVar6) break;
      pvVar7 = std::
               vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               ::operator[](emsgs_in,(ulong)pt._4_4_);
      pt_du = pvVar7->presentation_time_;
      pvVar7 = std::
               vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               ::operator[](emsgs_in,(ulong)pt._4_4_);
      uVar2 = pvVar7->presentation_time_;
      pvVar7 = std::
               vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               ::operator[](emsgs_in,(ulong)pt._4_4_);
      local_a0 = uVar2 + pvVar7->event_duration_;
      pvVar7 = std::
               vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               ::operator[](emsgs_in,(ulong)pt._4_4_);
      uVar2 = pt_du;
      if (pvVar7->event_duration_ == 0) {
        local_a0 = local_a0 + 1;
      }
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48,
                          (long)(s._40_4_ + 1));
      uVar6 = local_a0;
      if (uVar2 < *pvVar5) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48,
                            (long)(int)s._40_4_);
        if (*pvVar5 < uVar6) {
          pvVar7 = std::
                   vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                   ::operator[](emsgs_in,(ulong)pt._4_4_);
          DASHEventMessageBoxv1::DASHEventMessageBoxv1(&local_250,pvVar7);
          EventMessageInstanceBox::EventMessageInstanceBox(&local_178,&local_250,_auStack_88);
          std::
          vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
          ::push_back((vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                       *)&s.sample_duration_,&local_178);
          EventMessageInstanceBox::~EventMessageInstanceBox(&local_178);
          DASHEventMessageBoxv1::~DASHEventMessageBoxv1(&local_250);
          s.instance_boxes_.
          super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
        }
      }
      pt._4_4_ = pt._4_4_ + 1;
    }
    std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::push_back
              (samples_out,(value_type *)auStack_88);
    EventSample::~EventSample((EventSample *)auStack_88);
    s._40_4_ = s._40_4_ + 1;
  }
  sVar4 = std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::size
                    (samples_out);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48);
  return (uint32_t)sVar4;
}

Assistant:

uint32_t event_track::find_event_samples(
	const std::vector<event_track::DASHEventMessageBoxv1> &emsgs_in,
	std::vector<event_track::EventSample> &samples_out,
	uint64_t segment_start ,
	uint64_t segment_end, 
	bool is_vtt)
{

	std::vector<uint64_t> sample_boundaries = std::vector<uint64_t>();
	find_sample_boundaries(emsgs_in, sample_boundaries, segment_start, segment_end);

	for (int i = 0; i < (int)sample_boundaries.size() - 1; i++)
	{
		event_track::EventSample s;
		s.sample_presentation_time_ = sample_boundaries[i];
		s.sample_duration_ = (int32_t)((int64_t)sample_boundaries[i + 1] - (int64_t)sample_boundaries[i]);
		
		s.is_emeb_ = true;
		s.is_vtt_ = is_vtt;

		for (unsigned int k = 0; k < emsgs_in.size(); k++)
		{
			uint64_t pt = emsgs_in[k].presentation_time_;
			uint64_t pt_du = emsgs_in[k].presentation_time_ + emsgs_in[k].event_duration_;

			if (emsgs_in[k].event_duration_ == 0)
				pt_du += 1;

			// event is active during sample duration 
			if (pt < sample_boundaries[i+1] && pt_du > sample_boundaries[i])
			{
				s.instance_boxes_.push_back(event_track::EventMessageInstanceBox(emsgs_in[k], s.sample_presentation_time_));
				s.is_emeb_ = false;
			}
		}
		samples_out.push_back(s);
	}

	return (uint32_t)samples_out.size();
}